

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigen.h
# Opt level: O1

handle pybind11::detail::type_caster<Eigen::Matrix<double,1,5,1,1,5>,void>::
       cast_impl<Eigen::Matrix<double,1,5,1,1,5>const>
                 (Matrix<double,_1,_5,_1,_1,_5> *src,return_value_policy policy,handle parent)

{
  double dVar1;
  double dVar2;
  double dVar3;
  Matrix<double,_1,_5,_1,_1,_5> *pMVar4;
  handle hVar5;
  cast_error *this;
  bool writeable;
  undefined7 in_register_00000031;
  object local_18;
  
  switch(CONCAT71(in_register_00000031,policy) & 0xffffffff) {
  case 0:
  case 2:
    break;
  case 1:
  case 5:
    local_18.super_handle.m_ptr = (handle)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    hVar5 = eigen_array_cast<pybind11::detail::EigenProps<Eigen::Matrix<double,1,5,1,1,5>>>
                      (src,(PyObject *)&_Py_NoneStruct,false);
    object::~object(&local_18);
    return (handle)hVar5.m_ptr;
  case 3:
    parent.m_ptr = (PyObject *)0x0;
    writeable = true;
    goto LAB_0024a79c;
  case 4:
    pMVar4 = (Matrix<double,_1,_5,_1,_1,_5> *)
             Eigen::PlainObjectBase<Eigen::Matrix<double,1,5,1,1,5>>::operator_new
                       ((PlainObjectBase<Eigen::Matrix<double,1,5,1,1,5>> *)0x28,
                        CONCAT71(in_register_00000031,policy));
    dVar1 = (src->super_PlainObjectBase<Eigen::Matrix<double,_1,_5,_1,_1,_5>_>).m_storage.m_data.
            array[1];
    dVar2 = (src->super_PlainObjectBase<Eigen::Matrix<double,_1,_5,_1,_1,_5>_>).m_storage.m_data.
            array[2];
    dVar3 = (src->super_PlainObjectBase<Eigen::Matrix<double,_1,_5,_1,_1,_5>_>).m_storage.m_data.
            array[3];
    (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_1,_5,_1,_1,_5>_>).m_storage.m_data.array[0]
         = (src->super_PlainObjectBase<Eigen::Matrix<double,_1,_5,_1,_1,_5>_>).m_storage.m_data.
           array[0];
    (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_1,_5,_1,_1,_5>_>).m_storage.m_data.array[1]
         = dVar1;
    (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_1,_5,_1,_1,_5>_>).m_storage.m_data.array[2]
         = dVar2;
    (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_1,_5,_1,_1,_5>_>).m_storage.m_data.array[3]
         = dVar3;
    (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_1,_5,_1,_1,_5>_>).m_storage.m_data.array[4]
         = (src->super_PlainObjectBase<Eigen::Matrix<double,_1,_5,_1,_1,_5>_>).m_storage.m_data.
           array[4];
    src = pMVar4;
    break;
  case 6:
    writeable = false;
LAB_0024a79c:
    hVar5 = eigen_array_cast<pybind11::detail::EigenProps<Eigen::Matrix<double,1,5,1,1,5>>>
                      (src,parent,writeable);
    return (handle)hVar5.m_ptr;
  default:
    this = (cast_error *)__cxa_allocate_exception(0x10);
    cast_error::runtime_error(this,"unhandled return_value_policy: should not happen!");
    __cxa_throw(this,&cast_error::typeinfo,std::runtime_error::~runtime_error);
  }
  hVar5 = eigen_encapsulate<pybind11::detail::EigenProps<Eigen::Matrix<double,1,5,1,1,5>>,Eigen::Matrix<double,1,5,1,1,5>const,void>
                    (src);
  return (handle)hVar5.m_ptr;
}

Assistant:

static handle cast_impl(CType *src, return_value_policy policy, handle parent) {
        switch (policy) {
            case return_value_policy::take_ownership:
            case return_value_policy::automatic:
                return eigen_encapsulate<props>(src);
            case return_value_policy::move:
                return eigen_encapsulate<props>(new CType(std::move(*src)));
            case return_value_policy::copy:
                return eigen_array_cast<props>(*src);
            case return_value_policy::reference:
            case return_value_policy::automatic_reference:
                return eigen_ref_array<props>(*src);
            case return_value_policy::reference_internal:
                return eigen_ref_array<props>(*src, parent);
            default:
                throw cast_error("unhandled return_value_policy: should not happen!");
        };
    }